

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void __thiscall diy::MemoryBuffer::wipe(MemoryBuffer *this)

{
  MemoryBuffer *in_RDI;
  undefined1 local_20 [8];
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  memset(local_20,0,0x18);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x11f69d);
  std::vector<char,_std::allocator<char>_>::swap
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffff0);
  reset(in_RDI);
  return;
}

Assistant:

void                wipe()                                      { std::vector<char>().swap(buffer); reset(); }